

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_demangle.h
# Opt level: O0

void cute::cute_impl_demangle::patchresultforstring(string *result)

{
  int iVar1;
  cute_impl_demangle *this;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *name;
  size_type pos;
  string *result_local;
  
  if ((patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_)
     , iVar1 != 0)) {
    this = (cute_impl_demangle *)std::type_info::name((type_info *)&std::__cxx11::string::typeinfo);
    plain_demangle_abi_cxx11_
              (&patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_,this,name);
    __cxa_atexit(std::__cxx11::string::~string,
                 &patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_);
  }
  while (uVar2 = std::__cxx11::string::find((string *)result,0x1a63f0), uVar2 != 0xffffffffffffffff)
  {
    lVar3 = std::__cxx11::string::size();
    iVar1 = std::__cxx11::string::compare((ulong)result,uVar2 + lVar3,(char *)0x2,0x186ca3);
    if (iVar1 == 0) {
      lVar3 = std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)result,uVar2 + lVar3);
    }
    pcVar4 = (char *)std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)result,uVar2,pcVar4);
  }
  patch_library_namespace(result);
  return;
}

Assistant:

inline void patchresultforstring(std::string& result) {
	static const std::string stringid=plain_demangle(typeid(std::string).name());
	std::string::size_type pos=std::string::npos;
	while(std::string::npos != (pos=result.find(stringid))){
		if (!result.compare(pos+stringid.size(),2," >",2)) result.erase(pos+stringid.size(),1); // makes templates look nice
		result.replace(pos,stringid.size(),"std::string");
	}
	patch_library_namespace(result);
}